

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mangle.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  result_type rVar8;
  result_type rVar9;
  result_type rVar10;
  result_type rVar11;
  ostream *poVar12;
  long lVar13;
  result_type rVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  file_handle file;
  memory_mapper mapper;
  random_generator<unsigned_long> rand;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e10;
  size_type local_1e08;
  uint local_1e00 [2];
  undefined4 uStack_1df8;
  undefined4 uStack_1df4;
  file_handle local_1df0;
  memory_mapper local_1dc0;
  anon_union_5000_2_650ea050_for_random_device_0 local_1d90;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_a08;
  uniform_int_distribution<unsigned_long> local_40;
  
  if (argc == 2) {
    std::random_device::random_device((random_device *)&local_1d90.field_0);
    uVar5 = std::random_device::_M_getval();
    local_a08._M_x[0] = (unsigned_long)uVar5;
    lVar6 = 1;
    lVar13 = 0x272;
    uVar17 = local_a08._M_x[0];
    do {
      lVar16 = (uVar17 >> 0x3e ^ uVar17) * 0x5851f42d4c957f2d;
      uVar17 = lVar16 + lVar6;
      *(long *)((long)&local_1d90 + lVar13 * 8) = lVar13 + lVar16 + -0x271;
      lVar6 = lVar6 + 1;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x3a9);
    local_a08._M_p = 0x138;
    local_40._M_param._M_a = 0;
    local_40._M_param._M_b = 0xffffffffffffffff;
    std::__cxx11::string::string((string *)&local_1e10,argv[1],(allocator *)&local_1dc0);
    local_1df0.path_._M_dataplus._M_p = (pointer)&local_1df0.path_.field_2;
    local_1df0.super_file_base._vptr_file_base = (_func_int **)&PTR__file_handle_0010e8f0;
    if (local_1e10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e00) {
      local_1df0.path_.field_2._8_4_ = uStack_1df8;
      local_1df0.path_.field_2._12_4_ = uStack_1df4;
    }
    else {
      local_1df0.path_._M_dataplus._M_p = (pointer)local_1e10;
    }
    local_1df0.path_._M_string_length = local_1e08;
    local_1e08 = 0;
    local_1e00[0] = local_1e00[0] & 0xffffff00;
    local_1df0.file_ = -1;
    local_1df0.is_writable_ = false;
    local_1e10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1e00;
    pstore::file::file_handle::open(&local_1df0,(char *)0x1,1);
    pstore::memory_mapper::memory_mapper(&local_1dc0,&local_1df0,true,0,0xb0);
    if (local_1dc0.super_memory_mapper_base.ptr_.
        super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1dc0.super_memory_mapper_base.ptr_.
         super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
             (local_1dc0.super_memory_mapper_base.ptr_.
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             + 1;
        UNLOCK();
      }
      else {
        (local_1dc0.super_memory_mapper_base.ptr_.
         super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
             (local_1dc0.super_memory_mapper_base.ptr_.
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             + 1;
      }
    }
    rVar8 = std::uniform_int_distribution<unsigned_long>::operator()
                      (&local_40,&local_a08,&local_40._M_param);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rVar8;
    rVar14 = rVar8 / 0x11 + (SUB168(auVar1 * ZEXT816(0xf0f0f0f0f0f0f0f1),8) & 0xfffffffffffffff0);
    if (rVar8 != rVar14) {
      uVar17 = 0;
      do {
        rVar9 = std::uniform_int_distribution<unsigned_long>::operator()
                          (&local_40,&local_a08,&local_40._M_param);
        rVar10 = std::uniform_int_distribution<unsigned_long>::operator()
                           (&local_40,&local_a08,&local_40._M_param);
        rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                           (&local_40,&local_a08,&local_40._M_param);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = rVar10;
        bVar3 = (char)rVar10 + (char)(SUB164(auVar2 * ZEXT816(0x8080808080808081),8) >> 7);
        bVar4 = bVar3 | 0x80;
        if ((rVar11 & 1) == 0) {
          bVar4 = bVar3;
        }
        if (rVar11 == 0xffffffffffffffff) {
          bVar4 = bVar3;
        }
        *(byte *)((long)local_1dc0.super_memory_mapper_base.ptr_.
                        super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr + rVar9 % 0xb0)
             = bVar4;
        uVar17 = uVar17 + 1;
      } while (uVar17 < rVar8 - rVar14);
    }
    if (local_1dc0.super_memory_mapper_base.ptr_.
        super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1dc0.super_memory_mapper_base.ptr_.
                 super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    pstore::memory_mapper::~memory_mapper(&local_1dc0);
    pstore::file::file_handle::~file_handle(&local_1df0);
    std::random_device::_M_fini();
    iVar15 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Mangle returning ",0x11);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0);
    local_1d90._M_mt = (mt19937)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_1d90._M_mt,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1101a8);
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," path-name\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," \"Fuzzes\" the header and r0 footer of the given file.\n",
               0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," Warning: The file is modified in-place.\n",0x29);
    iVar15 = 1;
  }
  return iVar15;
}

Assistant:

int main (int argc, char ** argv) {
    int exit_code = EXIT_SUCCESS;

    if (argc != 2) {
        std::cout << "Usage: " << argv[0] << " path-name\n"
                  << " \"Fuzzes\" the header and r0 footer of the given file.\n"
                  << " Warning: The file is modified in-place.\n";
        return EXIT_FAILURE;
    }

    PSTORE_TRY {
        random_generator<std::size_t> rand;

        auto const header_size = pstore::leader_size + sizeof (pstore::trailer);

        pstore::file::file_handle file{argv[1]};
        file.open (pstore::file::file_handle::create_mode::open_existing,
                   pstore::file::file_handle::writable_mode::read_write);
        pstore::memory_mapper mapper (file,
                                      true,         // writable
                                      0,            // offset
                                      header_size); // length
        auto data = std::static_pointer_cast<std::uint8_t> (mapper.data ());
        auto ptr = data.get ();

        std::size_t const num_to_hit = rand.get (header_size / 10);
        for (std::size_t ctr = 0; ctr < num_to_hit; ctr++) {
            std::size_t const offset = rand.get (header_size);
            std::uint8_t new_value = rand.get () % std::numeric_limits<std::uint8_t>::max ();

            // We want the highest bit set more often, in case of signedness issues.
            if (rand.get () % 2) {
                new_value |= 0x80;
            }

            ptr[offset] = new_value;
        }
    }